

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like.cpp
# Opt level: O3

bool duckdb::TemplatedLikeOperator<(char)37,(char)95,true,duckdb::StandardCharacterReader>
               (char *sdata,idx_t slen,char *pdata,idx_t plen,char escape)

{
  ulong uVar1;
  char cVar2;
  long lVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  SyntaxException *this;
  ulong uVar7;
  ulong uVar8;
  char *sdata_00;
  idx_t slen_00;
  bool bVar9;
  string local_48;
  
  if (slen != 0 && plen != 0) {
    uVar5 = 0;
    uVar7 = 0;
    do {
      cVar2 = pdata[uVar5];
      if (cVar2 == escape) {
        uVar5 = uVar5 + 1;
        if (uVar5 == plen) {
          this = (SyntaxException *)__cxa_allocate_exception(0x10);
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_48,"Like pattern must not end with escape character!","");
          SyntaxException::SyntaxException(this,&local_48);
          __cxa_throw(this,&SyntaxException::typeinfo,::std::runtime_error::~runtime_error);
        }
        cVar2 = pdata[uVar5];
joined_r0x009f5b4d:
        if (cVar2 != sdata[uVar7]) {
          return false;
        }
      }
      else {
        if (cVar2 != '_') {
          if (cVar2 != '%') goto joined_r0x009f5b4d;
          uVar6 = uVar5 + 1;
          if (uVar5 + 1 < plen) {
            uVar6 = plen;
          }
          goto LAB_009f5bd2;
        }
        if (slen <= uVar7 + 1) {
          uVar7 = uVar7 + 1;
          if (uVar7 < slen) {
            uVar7 = slen;
          }
          uVar5 = uVar5 + 1;
          goto LAB_009f5b97;
        }
      }
      uVar7 = uVar7 + 1;
      uVar5 = uVar5 + 1;
      if ((plen <= uVar5) || (slen <= uVar7)) goto LAB_009f5b97;
    } while( true );
  }
  uVar7 = 0;
  uVar5 = 0;
LAB_009f5b97:
  uVar6 = uVar5;
  if (uVar5 < plen) {
    do {
      uVar6 = uVar5;
      if (pdata[uVar5] != '%') break;
      uVar5 = uVar5 + 1;
      uVar6 = plen;
    } while (plen != uVar5);
  }
  return uVar7 == slen && uVar6 == plen;
  while (lVar3 = uVar5 + 1, uVar5 = uVar1, uVar8 = uVar1, pdata[lVar3] == '%') {
LAB_009f5bd2:
    uVar1 = uVar5 + 1;
    uVar8 = uVar6;
    if (plen <= uVar1) break;
  }
  if (plen - uVar8 == 0) {
    return true;
  }
  if (slen < uVar7 || slen - uVar7 == 0) {
    return false;
  }
  sdata_00 = sdata + uVar7;
  slen_00 = slen - uVar7;
  do {
    bVar4 = TemplatedLikeOperator<(char)37,(char)95,true,duckdb::StandardCharacterReader>
                      (sdata_00,slen_00,pdata + uVar8,plen - uVar8,escape);
    if (bVar4) {
      return bVar4;
    }
    sdata_00 = sdata_00 + 1;
    bVar9 = slen_00 != 1;
    slen_00 = slen_00 - 1;
  } while (bVar9);
  return bVar4;
}

Assistant:

bool TemplatedLikeOperator(const char *sdata, idx_t slen, const char *pdata, idx_t plen, char escape) {
	idx_t pidx = 0;
	idx_t sidx = 0;
	for (; pidx < plen && sidx < slen; pidx++) {
		char pchar = READER::Operation(pdata, pidx);
		char schar = READER::Operation(sdata, sidx);
		if (HAS_ESCAPE && pchar == escape) {
			pidx++;
			if (pidx == plen) {
				throw SyntaxException("Like pattern must not end with escape character!");
			}
			if (pdata[pidx] != schar) {
				return false;
			}
			sidx++;
		} else if (pchar == UNDERSCORE) {
			READER::NextCharacter(sdata, slen, sidx);
		} else if (pchar == PERCENTAGE) {
			pidx++;
			while (pidx < plen && pdata[pidx] == PERCENTAGE) {
				pidx++;
			}
			if (pidx == plen) {
				return true; /* tail is acceptable */
			}
			for (; sidx < slen; sidx++) {
				if (TemplatedLikeOperator<PERCENTAGE, UNDERSCORE, HAS_ESCAPE, READER>(
				        sdata + sidx, slen - sidx, pdata + pidx, plen - pidx, escape)) {
					return true;
				}
			}
			return false;
		} else if (pchar == schar) {
			sidx++;
		} else {
			return false;
		}
	}
	while (pidx < plen && pdata[pidx] == PERCENTAGE) {
		pidx++;
	}
	return pidx == plen && sidx == slen;
}